

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void Lowerer::GenerateLdFldFromLocalInlineCache
               (Instr *instrLdFld,RegOpnd *opndBase,Opnd *opndDst,RegOpnd *opndInlineCache,
               LabelInstr *labelFallThru,bool isInlineSlot)

{
  BYTE BVar1;
  DWORD offset;
  IndirOpnd *pIVar2;
  RegOpnd *indexOpnd;
  RegOpnd *opndReg2;
  RegOpnd *opndSlotArray;
  IndirOpnd *opndIndir;
  bool isInlineSlot_local;
  LabelInstr *labelFallThru_local;
  RegOpnd *opndInlineCache_local;
  Opnd *opndDst_local;
  RegOpnd *opndBase_local;
  Instr *instrLdFld_local;
  
  opndReg2 = (RegOpnd *)0x0;
  if (!isInlineSlot) {
    opndReg2 = IR::RegOpnd::New(TyInt64,instrLdFld->m_func);
    offset = Js::DynamicObject::GetOffsetOfAuxSlots();
    pIVar2 = IR::IndirOpnd::New(opndBase,offset,TyInt64,instrLdFld->m_func,false);
    InsertMove(&opndReg2->super_Opnd,&pIVar2->super_Opnd,instrLdFld,true);
  }
  indexOpnd = IR::RegOpnd::New(TyInt64,instrLdFld->m_func);
  pIVar2 = IR::IndirOpnd::New(opndInlineCache,0x12,TyUint16,instrLdFld->m_func,false);
  InsertMove(&indexOpnd->super_Opnd,&pIVar2->super_Opnd,instrLdFld,true);
  if (isInlineSlot) {
    BVar1 = LowererMD::GetDefaultIndirScale();
    pIVar2 = IR::IndirOpnd::New(opndBase,indexOpnd,BVar1,TyInt64,instrLdFld->m_func);
    InsertMove(opndDst,&pIVar2->super_Opnd,instrLdFld,true);
  }
  else {
    BVar1 = LowererMD::GetDefaultIndirScale();
    pIVar2 = IR::IndirOpnd::New(opndReg2,indexOpnd,BVar1,TyInt64,instrLdFld->m_func);
    InsertMove(opndDst,&pIVar2->super_Opnd,instrLdFld,true);
  }
  InsertBranch(Br,labelFallThru,instrLdFld);
  return;
}

Assistant:

void
Lowerer::GenerateLdFldFromLocalInlineCache(
    IR::Instr * instrLdFld,
    IR::RegOpnd * opndBase,
    IR::Opnd * opndDst,
    IR::RegOpnd * opndInlineCache,
    IR::LabelInstr * labelFallThru,
    bool isInlineSlot)
{
    // Generate:
    //
    // s1 = MOV base->slots -- load the slot array
    // s2 = MOVZXw [&(inlineCache->u.local.slotIndex)] -- load the cached slot index
    // dst = MOV [s1 + s2 * Scale]  -- load the value directly from the slot
    //      JMP $fallthru

    IR::IndirOpnd * opndIndir = nullptr;
    IR::RegOpnd * opndSlotArray = nullptr;

    if (!isInlineSlot)
    {
        opndSlotArray = IR::RegOpnd::New(TyMachReg, instrLdFld->m_func);
        opndIndir = IR::IndirOpnd::New(opndBase, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachReg, instrLdFld->m_func);
        InsertMove(opndSlotArray, opndIndir, instrLdFld);
    }

    // s2 = MOVZXw [&(inlineCache->u.local.slotIndex)] -- load the cached slot index
    IR::RegOpnd * opndReg2 = IR::RegOpnd::New(TyMachReg, instrLdFld->m_func);
    opndIndir = IR::IndirOpnd::New(opndInlineCache, (int32)offsetof(Js::InlineCache, u.local.slotIndex), TyUint16, instrLdFld->m_func);
    InsertMove(opndReg2, opndIndir, instrLdFld);

    if (isInlineSlot)
    {
        // dst = MOV [base + s2 * Scale]  -- load the value directly from the slot
        opndIndir = IR::IndirOpnd::New(opndBase, opndReg2, LowererMD::GetDefaultIndirScale(), TyMachReg, instrLdFld->m_func);
        InsertMove(opndDst, opndIndir, instrLdFld);
    }
    else
    {
        // dst = MOV [s1 + s2 * Scale]  -- load the value directly from the slot
        opndIndir = IR::IndirOpnd::New(opndSlotArray, opndReg2, LowererMD::GetDefaultIndirScale(), TyMachReg, instrLdFld->m_func);
        InsertMove(opndDst, opndIndir, instrLdFld);
    }

    // JMP $fallthru
    InsertBranch(Js::OpCode::Br, labelFallThru, instrLdFld);
}